

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::CreateRejectedPromise
              (Var resolution,ScriptContext *scriptContext,Var promiseConstructor)

{
  JavascriptPromiseCapability *pJVar1;
  
  if (promiseConstructor == (Var)0x0) {
    promiseConstructor =
         (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .promiseConstructor.ptr;
  }
  pJVar1 = NewPromiseCapability(promiseConstructor,scriptContext);
  TryCallResolveOrRejectHandler((pJVar1->reject).ptr,resolution,scriptContext);
  return (pJVar1->promise).ptr;
}

Assistant:

Var JavascriptPromise::CreateRejectedPromise(Var resolution, ScriptContext* scriptContext, Var promiseConstructor)
    {
        if (promiseConstructor == nullptr)
        {
            promiseConstructor = scriptContext->GetLibrary()->GetPromiseConstructor();
        }

        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(promiseConstructor, scriptContext);

        TryCallResolveOrRejectHandler(promiseCapability->GetReject(), resolution, scriptContext);

        return promiseCapability->GetPromise();
    }